

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O1

void __thiscall sc_core::vcd_trace_file::~vcd_trace_file(vcd_trace_file *this)

{
  bool bVar1;
  pointer ppvVar2;
  long lVar3;
  unit_type now_units_low;
  unit_type now_units_high;
  unit_type local_20;
  unit_type local_18;
  
  (this->super_sc_trace_file_base).super_sc_trace_file._vptr_sc_trace_file =
       (_func_int **)&PTR_trace_0026fe60;
  (this->super_sc_trace_file_base).super_sc_object._vptr_sc_object =
       (_func_int **)&PTR_print_0026ffa0;
  bVar1 = sc_trace_file_base::is_initialized(&this->super_sc_trace_file_base);
  if (bVar1) {
    bVar1 = get_time_stamp(this,&local_18,&local_20);
    if (bVar1) {
      print_time_stamp(this,local_18,local_20);
    }
  }
  ppvVar2 = (this->traces).
            super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->traces).
                              super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2) >> 3)) {
    lVar3 = 0;
    do {
      if (ppvVar2[lVar3] != (vcd_trace *)0x0) {
        (*ppvVar2[lVar3]->_vptr_vcd_trace[5])();
      }
      lVar3 = lVar3 + 1;
      ppvVar2 = (this->traces).
                super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(this->traces).
                                         super__Vector_base<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar2)
                          >> 3));
  }
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
  }
  sc_trace_file_base::~sc_trace_file_base(&this->super_sc_trace_file_base);
  return;
}

Assistant:

vcd_trace_file::~vcd_trace_file()
{
    unit_type now_units_high, now_units_low;
    if (is_initialized() && get_time_stamp(now_units_high,now_units_low)) {
        print_time_stamp(now_units_high, now_units_low);
    }

    for( int i = 0; i < (int)traces.size(); i++ ) {
        vcd_trace* t = traces[i];
        delete t;
    }
}